

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::CalcCombinedCoordMatrix
          (ChElementShellANCF_3833 *this,MatrixNx6 *ebar_ebardot)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false> local_60;
  
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (PointerType)ebar_ebardot;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 1;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 9;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 1;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0xc;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 2;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((((this->m_nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0xf;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 2;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x12;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x15;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x18;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 4;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x1b;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 4;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x1e;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 5;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x21;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 5;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x24;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x27;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 6;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x2a;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 7;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x2d;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 7;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x30;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 8;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x33;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 8;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x36;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 9;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x39;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 9;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x3c;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 10;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x3f;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 10;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x42;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xb;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x45;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xb;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x48;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xc;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x4b;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xc;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x4e;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xd;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x51;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xd;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x54;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xe;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x57;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xe;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x5a;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xf;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x5d;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0xf;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x60;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x10;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 99;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x10;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x66;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x11;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x69;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x11;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x6c;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x12;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x6f;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x12;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x72;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x13;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x75;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x13;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x78;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x14;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[6].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x7b;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x14;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x7e;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x20);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x15;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x81;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x15;
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x38);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0xf0);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x84;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x16;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x108);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x87;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x16;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->m_nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyzD + 0x140);
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x8a;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x17;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 0;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  local_70.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start[7].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           DD_dt).m_data;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false>,_0>.m_data =
       (ebar_ebardot->super_PlainObjectBase<Eigen::Matrix<double,_24,_6,_1,_24,_6>_>).m_storage.
       m_data.array + 0x8d;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startRow.
  m_value = 0x17;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_startCol.
  m_value = 3;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_outerStride = 6
  ;
  local_60.super_BlockImpl<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_24,_6,_1,_24,_6>,_1,_3,_false,_true>.m_xpr =
       ebar_ebardot;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,6,1,24,6>,1,3,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_60,&local_70);
  return;
}

Assistant:

void ChElementShellANCF_3833::CalcCombinedCoordMatrix(MatrixNx6& ebar_ebardot) {
    ebar_ebardot.template block<1, 3>(0, 0) = m_nodes[0]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(0, 3) = m_nodes[0]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(1, 0) = m_nodes[0]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(1, 3) = m_nodes[0]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(2, 0) = m_nodes[0]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(2, 3) = m_nodes[0]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(3, 0) = m_nodes[1]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(3, 3) = m_nodes[1]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(4, 0) = m_nodes[1]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(4, 3) = m_nodes[1]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(5, 0) = m_nodes[1]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(5, 3) = m_nodes[1]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(6, 0) = m_nodes[2]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(6, 3) = m_nodes[2]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(7, 0) = m_nodes[2]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(7, 3) = m_nodes[2]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(8, 0) = m_nodes[2]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(8, 3) = m_nodes[2]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(9, 0) = m_nodes[3]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(9, 3) = m_nodes[3]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(10, 0) = m_nodes[3]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(10, 3) = m_nodes[3]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(11, 0) = m_nodes[3]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(11, 3) = m_nodes[3]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(12, 0) = m_nodes[4]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(12, 3) = m_nodes[4]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(13, 0) = m_nodes[4]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(13, 3) = m_nodes[4]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(14, 0) = m_nodes[4]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(14, 3) = m_nodes[4]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(15, 0) = m_nodes[5]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(15, 3) = m_nodes[5]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(16, 0) = m_nodes[5]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(16, 3) = m_nodes[5]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(17, 0) = m_nodes[5]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(17, 3) = m_nodes[5]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(18, 0) = m_nodes[6]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(18, 3) = m_nodes[6]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(19, 0) = m_nodes[6]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(19, 3) = m_nodes[6]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(20, 0) = m_nodes[6]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(20, 3) = m_nodes[6]->GetDD_dt().eigen();

    ebar_ebardot.template block<1, 3>(21, 0) = m_nodes[7]->GetPos().eigen();
    ebar_ebardot.template block<1, 3>(21, 3) = m_nodes[7]->GetPos_dt().eigen();
    ebar_ebardot.template block<1, 3>(22, 0) = m_nodes[7]->GetD().eigen();
    ebar_ebardot.template block<1, 3>(22, 3) = m_nodes[7]->GetD_dt().eigen();
    ebar_ebardot.template block<1, 3>(23, 0) = m_nodes[7]->GetDD().eigen();
    ebar_ebardot.template block<1, 3>(23, 3) = m_nodes[7]->GetDD_dt().eigen();
}